

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O0

uint32_t MurmurHash2(void *key,int len,uint32_t seed)

{
  uint uVar1;
  uint32_t k;
  uchar *data;
  uint32_t h;
  int r;
  uint32_t m;
  uint32_t seed_local;
  int len_local;
  void *key_local;
  
  h = seed ^ len;
  data = (uchar *)key;
  for (len_local = len; 3 < len_local; len_local = len_local + -4) {
    h = ((uint)(*(int *)data * 0x5bd1e995) >> 0x18 ^ *(int *)data * 0x5bd1e995) * 0x5bd1e995 ^
        h * 0x5bd1e995;
    data = data + 4;
  }
  if (len_local != 1) {
    if (len_local != 2) {
      if (len_local != 3) goto LAB_001be238;
      h = (uint)data[2] << 0x10 ^ h;
    }
    h = (uint)data[1] << 8 ^ h;
  }
  h = (*data ^ h) * 0x5bd1e995;
LAB_001be238:
  uVar1 = (h >> 0xd ^ h) * 0x5bd1e995;
  return uVar1 >> 0xf ^ uVar1;
}

Assistant:

uint32_t MurmurHash2 ( const void * key, int len, uint32_t seed )
{
  // 'm' and 'r' are mixing constants generated offline.
  // They're not really 'magic', they just happen to work well.

  const uint32_t m = 0x5bd1e995;
  const int r = 24;

  // Initialize the hash to a 'random' value

  uint32_t h = seed ^ len;

  // Mix 4 bytes at a time into the hash

  const unsigned char * data = (const unsigned char *)key;

  while(len >= 4)
  {
    uint32_t k = *(uint32_t*)data;

    k *= m;
    k ^= k >> r;
    k *= m;

    h *= m;
    h ^= k;

    data += 4;
    len -= 4;
  }

  // Handle the last few bytes of the input array

  switch(len)
  {
  case 3: h ^= data[2] << 16;
  case 2: h ^= data[1] << 8;
  case 1: h ^= data[0];
      h *= m;
  };

  // Do a few final mixes of the hash to ensure the last few
  // bytes are well-incorporated.

  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;

  return h;
}